

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PathDescriptionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PathDescriptionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PathSuffixSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *args_2,Token *args_3,Token *args_4,
          PathSuffixSyntax *args_5,Token *args_6)

{
  Token openParen;
  Token edgeIdentifier;
  Token polarityOperator;
  Token pathOperator;
  Token closeParen;
  PathDescriptionSyntax *this_00;
  
  this_00 = (PathDescriptionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PathDescriptionSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (PathDescriptionSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  openParen.kind = args->kind;
  openParen._2_1_ = args->field_0x2;
  openParen.numFlags.raw = (args->numFlags).raw;
  openParen.rawLen = args->rawLen;
  openParen.info = args->info;
  edgeIdentifier.kind = args_1->kind;
  edgeIdentifier._2_1_ = args_1->field_0x2;
  edgeIdentifier.numFlags.raw = (args_1->numFlags).raw;
  edgeIdentifier.rawLen = args_1->rawLen;
  edgeIdentifier.info = args_1->info;
  closeParen.kind = args_6->kind;
  closeParen._2_1_ = args_6->field_0x2;
  closeParen.numFlags.raw = (args_6->numFlags).raw;
  closeParen.rawLen = args_6->rawLen;
  closeParen.info = args_6->info;
  pathOperator.kind = args_4->kind;
  pathOperator._2_1_ = args_4->field_0x2;
  pathOperator.numFlags.raw = (args_4->numFlags).raw;
  pathOperator.rawLen = args_4->rawLen;
  pathOperator.info = args_4->info;
  polarityOperator.kind = args_3->kind;
  polarityOperator._2_1_ = args_3->field_0x2;
  polarityOperator.numFlags.raw = (args_3->numFlags).raw;
  polarityOperator.rawLen = args_3->rawLen;
  polarityOperator.info = args_3->info;
  slang::syntax::PathDescriptionSyntax::PathDescriptionSyntax
            (this_00,openParen,edgeIdentifier,args_2,polarityOperator,pathOperator,args_5,closeParen
            );
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }